

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

RealType __thiscall OpenMD::Stats::getRealError(Stats *this,int index)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  dVar3 = *(double *)(lVar1 + 0x20) - *(double *)(lVar1 + 0x18) * *(double *)(lVar1 + 0x18);
  dVar2 = 0.0;
  if (0.0 <= dVar3) {
    dVar2 = dVar3;
  }
  return (SQRT(dVar2) * 1.96) /
         SQRT(((double)CONCAT44(0x45300000,(int)((ulong)*(undefined8 *)(lVar1 + 8) >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)*(undefined8 *)(lVar1 + 8)) - 4503599627370496.0));
}

Assistant:

RealType Stats::getRealError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    RealType value(0.0);
    dynamic_cast<Accumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }